

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfers.c
# Opt level: O3

transfer_type_t parse_transfer_type(char *value)

{
  byte bVar1;
  
  bVar1 = *value;
  switch(bVar1) {
  case 0x30:
    if (value[1] == '\0') {
      return TT_RECOMMENDED;
    }
    break;
  case 0x31:
    if (value[1] == '\0') {
      return TT_TIMED;
    }
    break;
  case 0x32:
    return (uint)(value[1] != '\0') * 2 + TT_TIME_REQUIRED;
  case 0x33:
    return TT_NOT_SET - (value[1] == '\0');
  default:
    if (bVar1 == 0) {
      return (uint)bVar1;
    }
  }
  return TT_NOT_SET;
}

Assistant:

transfer_type_t parse_transfer_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return TT_RECOMMENDED;
    else if (strcmp(value, "1") == 0)
        return TT_TIMED;
    else if (strcmp(value, "2") == 0)
        return TT_TIME_REQUIRED;
    else if (strcmp(value, "3") == 0)
        return TT_NOT_POSSIBLE;
    else
        return TT_NOT_SET;
}